

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_59::InMemoryFile::WritableFileMappingImpl::sync(WritableFileMappingImpl *this)

{
  InMemoryFile *pIVar1;
  long lVar2;
  
  pIVar1 = (this->ref).ptr;
  kj::_::Mutex::lock(&(pIVar1->impl).mutex);
  lVar2 = (*(code *)**(undefined8 **)(pIVar1->impl).value.clock)();
  (pIVar1->impl).value.lastModified.value.value = lVar2;
  kj::_::Mutex::unlock(&(pIVar1->impl).mutex,EXCLUSIVE,(Waiter *)0x0);
  return;
}

Assistant:

void sync(ArrayPtr<byte> slice) const override {
      ref->impl.lockExclusive()->modified();
    }